

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CollationDataBuilder::addContextTrie
          (CollationDataBuilder *this,uint32_t defaultCE32,UCharsTrieBuilder *trieBuilder,
          UErrorCode *errorCode)

{
  UBool UVar1;
  UnicodeString *pUVar2;
  int32_t local_c8;
  int32_t index;
  UnicodeString trieString;
  undefined1 local_70 [8];
  UnicodeString context;
  UErrorCode *errorCode_local;
  UCharsTrieBuilder *trieBuilder_local;
  uint32_t defaultCE32_local;
  CollationDataBuilder *this_local;
  
  context.fUnion._48_8_ = errorCode;
  UnicodeString::UnicodeString((UnicodeString *)local_70);
  trieBuilder_local._6_2_ = (char16_t)(defaultCE32 >> 0x10);
  pUVar2 = UnicodeString::append((UnicodeString *)local_70,trieBuilder_local._6_2_);
  trieBuilder_local._4_2_ = (char16_t)defaultCE32;
  UnicodeString::append(pUVar2,trieBuilder_local._4_2_);
  UnicodeString::UnicodeString((UnicodeString *)&index);
  pUVar2 = UCharsTrieBuilder::buildUnicodeString
                     (trieBuilder,USTRINGTRIE_BUILD_SMALL,(UnicodeString *)&index,
                      (UErrorCode *)context.fUnion._48_8_);
  UnicodeString::append((UnicodeString *)local_70,pUVar2);
  UVar1 = ::U_FAILURE(*(UErrorCode *)context.fUnion._48_8_);
  if (UVar1 == '\0') {
    local_c8 = UnicodeString::indexOf(&this->contexts,(UnicodeString *)local_70);
    if (local_c8 < 0) {
      local_c8 = UnicodeString::length(&this->contexts);
      UnicodeString::append(&this->contexts,(UnicodeString *)local_70);
    }
    this_local._4_4_ = local_c8;
  }
  else {
    this_local._4_4_ = -1;
  }
  UnicodeString::~UnicodeString((UnicodeString *)&index);
  UnicodeString::~UnicodeString((UnicodeString *)local_70);
  return this_local._4_4_;
}

Assistant:

int32_t
CollationDataBuilder::addContextTrie(uint32_t defaultCE32, UCharsTrieBuilder &trieBuilder,
                                     UErrorCode &errorCode) {
    UnicodeString context;
    context.append((UChar)(defaultCE32 >> 16)).append((UChar)defaultCE32);
    UnicodeString trieString;
    context.append(trieBuilder.buildUnicodeString(USTRINGTRIE_BUILD_SMALL, trieString, errorCode));
    if(U_FAILURE(errorCode)) { return -1; }
    int32_t index = contexts.indexOf(context);
    if(index < 0) {
        index = contexts.length();
        contexts.append(context);
    }
    return index;
}